

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O0

void TestSplitTwice(void)

{
  ostream *poVar1;
  size_t bytes;
  undefined1 auVar2 [16];
  istream is2;
  char buffer [6];
  istream is;
  OutputBuffer buf1;
  string msg1;
  lazy_ostream *in_stack_fffffffffffffad8;
  char *__off;
  fpos<__mbstate_t> *in_stack_fffffffffffffae0;
  char *in_stack_fffffffffffffae8;
  begin *in_stack_fffffffffffffaf0;
  OutputBuffer *in_stack_fffffffffffffaf8;
  InputBuffer *in_stack_fffffffffffffb00;
  size_t in_stack_fffffffffffffb08;
  OutputBuffer *this;
  const_string *in_stack_fffffffffffffb18;
  size_t in_stack_fffffffffffffb20;
  const_string *in_stack_fffffffffffffb28;
  undefined7 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb37;
  begin *in_stack_fffffffffffffb48;
  unit_test_log_t *in_stack_fffffffffffffb50;
  fpos local_470 [16];
  undefined8 local_460;
  undefined8 local_458;
  undefined1 local_450 [208];
  InputBuffer *in_stack_fffffffffffffc80;
  fpos local_2b0 [18];
  char local_29e [5];
  undefined1 local_299;
  char local_298 [416];
  fpos<__mbstate_t> local_f8;
  basic_cstring<const_char> local_e8;
  undefined1 local_d8 [56];
  basic_cstring<const_char> local_a0 [2];
  string local_80 [80];
  basic_cstring<const_char> local_30 [3];
  
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
             ,0x6d);
  boost::unit_test::log::begin::begin
            (in_stack_fffffffffffffaf0,(const_string *)in_stack_fffffffffffffae8,
             (size_t)in_stack_fffffffffffffae0);
  boost::unit_test::unit_test_log_t::operator<<(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48)
  ;
  boost::unit_test::unit_test_log_t::operator()
            ((unit_test_log_t *)in_stack_fffffffffffffae8,
             (log_level)((ulong)in_stack_fffffffffffffae0 >> 0x20));
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            ((lazy_ostream *)in_stack_fffffffffffffae8,(char (*) [15])in_stack_fffffffffffffae0);
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[15],_const_char_(&)[15]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[15],_const_char_(&)[15]> *)
             0x237bf4);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)in_stack_fffffffffffffae0);
  makeString_abi_cxx11_(in_stack_fffffffffffffb08);
  avro::OutputBuffer::OutputBuffer
            ((OutputBuffer *)in_stack_fffffffffffffb00,(size_type)in_stack_fffffffffffffaf8);
  std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  avro::OutputBuffer::writeTo
            ((OutputBuffer *)in_stack_fffffffffffffae0,(data_type *)in_stack_fffffffffffffad8,
             0x237c62);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffae8,(char (*) [1])in_stack_fffffffffffffae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_f8._M_state = (__mbstate_t)avro::OutputBuffer::size((OutputBuffer *)0x237d0c);
    local_f8._M_off = std::__cxx11::string::size();
    in_stack_fffffffffffffae8 = "msg1.size()";
    in_stack_fffffffffffffae0 = &local_f8;
    __off = "buf1.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_d8,&local_e8,0x336,1,2,&local_f8._M_state);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x237d95);
    in_stack_fffffffffffffb37 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffb37);
  avro::InputBuffer::InputBuffer(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  printBuffer(in_stack_fffffffffffffc80);
  avro::InputBuffer::~InputBuffer((InputBuffer *)0x237de1);
  avro::istream::istream
            ((istream *)in_stack_fffffffffffffaf0,(OutputBuffer *)in_stack_fffffffffffffae8);
  std::istream::readsome(local_298,(long)local_29e);
  local_299 = 0;
  poVar1 = std::operator<<((ostream *)&std::cout,"buffer =");
  poVar1 = std::operator<<(poVar1,local_29e);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_2b0._0_16_ = std::istream::tellg();
  this = local_2b0._8_8_;
  bytes = std::fpos::operator_cast_to_long(local_2b0);
  avro::OutputBuffer::discardData(this,bytes);
  avro::InputBuffer::InputBuffer(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  printBuffer(in_stack_fffffffffffffc80);
  avro::InputBuffer::~InputBuffer((InputBuffer *)0x237ef0);
  avro::istream::istream
            ((istream *)in_stack_fffffffffffffaf0,(OutputBuffer *)in_stack_fffffffffffffae8);
  std::fpos<__mbstate_t>::fpos(in_stack_fffffffffffffae0,(streamoff)__off);
  std::istream::seekg(local_450,local_460,local_458);
  auVar2 = std::istream::tellg();
  local_470 = (fpos  [16])auVar2;
  std::fpos::operator_cast_to_long(local_470);
  avro::OutputBuffer::discardData(this,bytes);
  avro::InputBuffer::InputBuffer(auVar2._0_8_,auVar2._8_8_);
  printBuffer(in_stack_fffffffffffffc80);
  avro::InputBuffer::~InputBuffer((InputBuffer *)0x237fc8);
  avro::istream::~istream((istream *)in_stack_fffffffffffffae0);
  avro::istream::~istream((istream *)in_stack_fffffffffffffae0);
  avro::OutputBuffer::~OutputBuffer((OutputBuffer *)0x237fef);
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

void TestSplitTwice() 
{
    BOOST_TEST_MESSAGE( "TestSplitTwice");
    {
        const std::string msg1 = makeString(30);

        avro::OutputBuffer buf1;
        buf1.writeTo(msg1.c_str(), msg1.size());

        BOOST_CHECK_EQUAL(buf1.size(), msg1.size());

        printBuffer(buf1);

        avro::istream is(buf1);
        char buffer[6];
        is.readsome(buffer, 5);
        buffer[5] = 0;
        std::cout << "buffer =" << buffer << std::endl;
        
        buf1.discardData(static_cast<size_t>(is.tellg()));
        printBuffer(buf1);

        avro::istream is2(buf1);
        is2.seekg(15);

        buf1.discardData(static_cast<size_t>(is2.tellg()));
        printBuffer(buf1);
    }
}